

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

SiPair * __thiscall
kj::Vector<kj::_::(anonymous_namespace)::SiPair>::add<kj::_::(anonymous_namespace)::SiPair>
          (Vector<kj::_::(anonymous_namespace)::SiPair> *this,SiPair *params)

{
  undefined8 *puVar1;
  long lVar2;
  SiPair *pSVar3;
  size_t sVar4;
  void *__dest;
  long lVar5;
  ulong uVar6;
  ulong capacity;
  undefined8 *puVar7;
  void *__src;
  size_t __n;
  
  puVar7 = *(undefined8 **)(this + 8);
  if (puVar7 == *(undefined8 **)(this + 0x10)) {
    puVar1 = *(undefined8 **)this;
    lVar5 = (long)puVar7 - (long)puVar1 >> 3;
    uVar6 = lVar5 * -0x5555555555555555;
    capacity = 4;
    if (puVar7 != puVar1) {
      capacity = lVar5 * 0x5555555555555556;
    }
    if (capacity <= uVar6 && uVar6 - capacity != 0) {
      *(undefined8 **)(this + 8) = puVar1 + capacity * 3;
    }
    __dest = _::HeapArrayDisposer::allocateImpl
                       (0x18,0,capacity,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    __src = *(void **)this;
    __n = *(long *)(this + 8) - (long)__src;
    if (__n != 0) {
      memcpy(__dest,__src,__n);
      __src = *(void **)this;
    }
    puVar7 = (undefined8 *)((long)__dest + __n);
    if (__src != (void *)0x0) {
      lVar5 = *(long *)(this + 8);
      lVar2 = *(long *)(this + 0x10);
      *(undefined8 *)this = 0;
      *(undefined8 *)(this + 8) = 0;
      *(undefined8 *)(this + 0x10) = 0;
      (**(code **)**(undefined8 **)(this + 0x18))
                (*(undefined8 **)(this + 0x18),__src,0x18,
                 (lVar5 - (long)__src >> 3) * -0x5555555555555555,
                 (lVar2 - (long)__src >> 3) * -0x5555555555555555,0);
    }
    *(void **)this = __dest;
    *(undefined8 **)(this + 8) = puVar7;
    *(void **)(this + 0x10) = (void *)((long)__dest + capacity * 0x18);
    *(undefined8 **)(this + 0x18) = &_::HeapArrayDisposer::instance;
  }
  puVar7[2] = *(undefined8 *)&params->i;
  sVar4 = (params->str).content.size_;
  *puVar7 = (params->str).content.ptr;
  puVar7[1] = sVar4;
  pSVar3 = *(SiPair **)(this + 8);
  *(SiPair **)(this + 8) = pSVar3 + 1;
  return pSVar3;
}

Assistant:

inline T& add(Params&&... params) KJ_LIFETIMEBOUND {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }